

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O1

bool __thiscall opencollada::ArgumentParser::parseArguments(ArgumentParser *this)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  ulong uVar3;
  _Rb_tree_node_base *p_Var4;
  MissingArgumentParameterException *this_00;
  MissingArgumentException *pMVar5;
  UnknowArgumentException *this_01;
  ulong uVar6;
  pointer pAVar7;
  long lVar8;
  pointer pbVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  
  pbVar9 = (this->mCommandLine).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(this->mCommandLine).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9)) {
    pAVar7 = (this->mNoSwitchArguments).
             super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = 1;
    do {
      iVar2 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
                      *)this,pbVar9 + uVar11);
      if ((_Rb_tree_header *)iVar2._M_node == &(this->mArguments)._M_t._M_impl.super__Rb_tree_header
         ) {
        if (pAVar7 == (this->mNoSwitchArguments).
                      super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          this_01 = (UnknowArgumentException *)__cxa_allocate_exception(0x48);
          UnknowArgumentException::UnknowArgumentException
                    (this_01,(this->mCommandLine).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar11);
          __cxa_throw(this_01,&UnknowArgumentException::typeinfo,
                      UnknowArgumentException::~UnknowArgumentException);
        }
        ::std::__cxx11::string::_M_assign
                  ((string *)
                   (pAVar7->mValues).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        pAVar7->mSet = true;
        pAVar7 = pAVar7 + 1;
      }
      else {
        p_Var10 = *(_Base_ptr *)(iVar2._M_node + 2);
        p_Var1 = iVar2._M_node[2]._M_parent;
        *(undefined1 *)&iVar2._M_node[5]._M_left = 1;
        if (p_Var1 == p_Var10) {
          uVar3 = 0;
        }
        else {
          lVar8 = 0;
          uVar6 = 0;
          do {
            if ((ulong)((long)(this->mCommandLine).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->mCommandLine).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6 + uVar11 + 1)
            {
              this_00 = (MissingArgumentParameterException *)__cxa_allocate_exception(0x48);
              MissingArgumentParameterException::MissingArgumentParameterException
                        (this_00,(this->mCommandLine).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar11);
              __cxa_throw(this_00,&MissingArgumentParameterException::typeinfo,
                          MissingArgumentParameterException::~MissingArgumentParameterException);
            }
            ::std::__cxx11::string::_M_assign((string *)((long)&p_Var10->_M_color + lVar8));
            uVar6 = uVar6 + 1;
            p_Var10 = *(_Base_ptr *)(iVar2._M_node + 2);
            uVar3 = (long)iVar2._M_node[2]._M_parent - (long)p_Var10 >> 5;
            lVar8 = lVar8 + 0x20;
          } while (uVar6 < uVar3);
        }
        uVar11 = uVar11 + uVar3;
      }
      uVar11 = uVar11 + 1;
      pbVar9 = (this->mCommandLine).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->mCommandLine).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5))
    ;
  }
  p_Var4 = (this->mArguments)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &(this->mArguments)._M_t._M_impl.super__Rb_tree_header) {
      pAVar7 = (this->mNoSwitchArguments).
               super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (pAVar7 == (this->mNoSwitchArguments).
                      super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        if ((pAVar7->mRequired == true) && (pAVar7->mSet == false)) break;
        pAVar7 = pAVar7 + 1;
      }
      pMVar5 = (MissingArgumentException *)__cxa_allocate_exception(0x48);
      MissingArgumentException::MissingArgumentException(pMVar5,&pAVar7->mHint);
      __cxa_throw(pMVar5,&MissingArgumentException::typeinfo,
                  MissingArgumentException::~MissingArgumentException);
    }
    if ((*(char *)((long)&p_Var4[5]._M_left + 1) == '\x01') && (*(char *)&p_Var4[5]._M_left == '\0')
       ) break;
    p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4);
  }
  pMVar5 = (MissingArgumentException *)__cxa_allocate_exception(0x48);
  MissingArgumentException::MissingArgumentException(pMVar5,(string *)(p_Var4 + 1));
  __cxa_throw(pMVar5,&MissingArgumentException::typeinfo,
              MissingArgumentException::~MissingArgumentException);
}

Assistant:

bool ArgumentParser::parseArguments()
	{
		try
		{
			auto noSwitchArgumentIt = mNoSwitchArguments.begin();
			for (size_t arg = 1; arg < mCommandLine.size();)
			{
				auto it = mArguments.find(mCommandLine[arg]);
				if (it == mArguments.end())
				{
					if (noSwitchArgumentIt != mNoSwitchArguments.end())
					{
						Argument& argument = *noSwitchArgumentIt;
						argument.setValue(mCommandLine[arg]);
						argument.isSet(true);
						++noSwitchArgumentIt;
						++arg;
						continue;
					}

                    throw UnknowArgumentException(mCommandLine[arg]);
				}

				Argument & argument = it->second;
				argument.isSet(true);
				for (size_t subArg = 0; subArg < argument.getNumParameters(); ++subArg)
				{
					size_t index = arg + subArg + 1;
					if (index >= mCommandLine.size())
					{
                        throw MissingArgumentParameterException(mCommandLine[arg]);
					}
					argument.setValue(mCommandLine[index], subArg);
				}
				arg += 1 + argument.getNumParameters();
			}

			for (const auto & argument : mArguments)
			{
				if (argument.second.isRequired() && !argument.second.isSet())
				{
                    throw MissingArgumentException(argument.first);
				}
			}

			for (const auto & argument : mNoSwitchArguments)
			{
				if (argument.isRequired() && !argument.isSet())
				{
					throw MissingArgumentException(argument.getHint());
				}
			}
		}
		catch (exception& e)
		{
			mParseError = e.what();
			return false;
		}
		return true;
	}